

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O0

void pcs_ready(PrimeCandidateSource *s)

{
  uint uVar1;
  uint32_t uVar2;
  uintmax_t uVar3;
  avoid *paVar4;
  ulong m;
  ulong uVar5;
  uint64_t uVar6;
  bool bVar7;
  uint local_68;
  long local_60;
  int64_t res;
  int64_t mod;
  size_t i_2;
  size_t out;
  int64_t last_mod;
  int64_t addend_m;
  int64_t factor_m;
  size_t i_1;
  size_t i;
  uint limit;
  PrimeCandidateSource *s_local;
  
  init_smallprimes();
  uVar1 = mp_hs_integer(s->addend,0x10000);
  if (uVar1 == 0) {
    uVar3 = mp_get_integer(s->addend);
    local_68 = (uint)uVar3;
  }
  else {
    local_68 = 0x10000;
  }
  i_1 = 0;
  while( true ) {
    bVar7 = false;
    if (i_1 < 0x198e) {
      bVar7 = smallprimes_array[i_1] < local_68;
    }
    if (!bVar7) break;
    paVar4 = (avoid *)safegrowarray(s->avoids,&s->avoidsize,8,s->navoids,1,false);
    s->avoids = paVar4;
    s->avoids[s->navoids].mod = (uint)smallprimes_array[i_1];
    s->avoids[s->navoids].res = 0;
    s->navoids = s->navoids + 1;
    i_1 = i_1 + 1;
  }
  if ((s->try_sophie_germain & 1U) != 0) {
    factor_m = 0;
    while( true ) {
      bVar7 = false;
      if ((ulong)factor_m < 0x198e) {
        bVar7 = smallprimes_array[factor_m] < local_68;
      }
      if (!bVar7) break;
      if (smallprimes_array[factor_m] != 2) {
        paVar4 = (avoid *)safegrowarray(s->avoids,&s->avoidsize,8,s->navoids,1,false);
        s->avoids = paVar4;
        s->avoids[s->navoids].mod = (uint)smallprimes_array[factor_m];
        s->avoids[s->navoids].res = (int)(smallprimes_array[factor_m] - 1) / 2;
        s->navoids = s->navoids + 1;
      }
      factor_m = factor_m + 1;
    }
  }
  if (s->avoid_modulus != 0) {
    paVar4 = (avoid *)safegrowarray(s->avoids,&s->avoidsize,8,s->navoids,1,false);
    s->avoids = paVar4;
    s->avoids[s->navoids].mod = s->avoid_modulus;
    s->avoids[s->navoids].res = s->avoid_residue;
    s->navoids = s->navoids + 1;
  }
  qsort(s->avoids,s->navoids,8,avoid_cmp);
  addend_m = 0;
  last_mod = 0;
  out = 0;
  i_2 = 0;
  mod = 0;
  do {
    if (s->navoids <= (ulong)mod) {
      s->navoids = i_2;
      s->ready = true;
      return;
    }
    uVar1 = s->avoids[mod].mod;
    m = (ulong)uVar1;
    uVar5 = (ulong)s->avoids[mod].res;
    if (m != out) {
      uVar2 = mp_mod_known_integer(s->addend,uVar1);
      last_mod = (int64_t)uVar2;
      uVar2 = mp_mod_known_integer(s->factor,uVar1);
      addend_m = (int64_t)uVar2;
      out = m;
    }
    if (addend_m == 0) {
      if (uVar5 == last_mod) {
        __assert_fail("res != addend_m",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                      ,0x15d,"void pcs_ready(PrimeCandidateSource *)");
      }
    }
    else {
      uVar6 = invert(addend_m,m);
      local_60 = (long)((uVar5 - last_mod) * uVar6) % (long)m;
      if (local_60 < 0) {
        local_60 = m + local_60;
      }
      s->avoids[i_2].mod = uVar1;
      s->avoids[i_2].res = (uint)local_60;
      i_2 = i_2 + 1;
    }
    mod = mod + 1;
  } while( true );
}

Assistant:

void pcs_ready(PrimeCandidateSource *s)
{
    /*
     * List all the small (modulus, residue) pairs we want to avoid.
     */

    init_smallprimes();

#define ADD_AVOID(newmod, newres) do {                          \
        sgrowarray(s->avoids, s->avoidsize, s->navoids);        \
        s->avoids[s->navoids].mod = (newmod);                   \
        s->avoids[s->navoids].res = (newres);                   \
        s->navoids++;                                           \
    } while (0)

    unsigned limit = (mp_hs_integer(s->addend, 65536) ? 65536 :
                      mp_get_integer(s->addend));

    /*
     * Don't be divisible by any small prime, or at least, any prime
     * smaller than our output number might actually manage to be. (If
     * asked to generate a really small prime, it would be
     * embarrassing to rule out legitimate answers on the grounds that
     * they were divisible by themselves.)
     */
    for (size_t i = 0; i < NSMALLPRIMES && smallprimes[i] < limit; i++)
        ADD_AVOID(smallprimes[i], 0);

    if (s->try_sophie_germain) {
        /*
         * If we're aiming to generate a Sophie Germain prime (i.e. p
         * such that 2p+1 is also prime), then we also want to ensure
         * 2p+1 is not congruent to 0 mod any small prime, because if
         * it is, we'll waste a lot of time generating a p for which
         * 2p+1 can't possibly work. So we have to avoid an extra
         * residue mod each odd q.
         *
         * We can simplify:        2p+1 ==  0      (mod q)
         *                    =>     2p == -1      (mod q)
         *                    =>      p == -2^{-1} (mod q)
         *
         * There's no need to do Euclid's algorithm to compute those
         * inverses, because for any odd q, the modular inverse of -2
         * mod q is just (q-1)/2. (Proof: multiplying it by -2 gives
         * 1-q, which is congruent to 1 mod q.)
         */
        for (size_t i = 0; i < NSMALLPRIMES && smallprimes[i] < limit; i++)
            if (smallprimes[i] != 2)
                ADD_AVOID(smallprimes[i], (smallprimes[i] - 1) / 2);
    }

    /*
     * Finally, if there's a particular modulus and residue we've been
     * told to avoid, put it on the list.
     */
    if (s->avoid_modulus)
        ADD_AVOID(s->avoid_modulus, s->avoid_residue);

#undef ADD_AVOID

    /*
     * Sort our to-avoid list by modulus. Partly this is so that we'll
     * check the smaller moduli first during the live runs, which lets
     * us spot most failing cases earlier rather than later. Also, it
     * brings equal moduli together, so that we can reuse the residue
     * we computed from a previous one.
     */
    qsort(s->avoids, s->navoids, sizeof(*s->avoids), avoid_cmp);

    /*
     * Next, adjust each of these moduli to take account of our factor
     * and addend. If we want factor*x+addend to avoid being congruent
     * to 'res' modulo 'mod', then x itself must avoid being congruent
     * to (res - addend) * factor^{-1}.
     *
     * If factor == 0 modulo mod, then the answer will have a fixed
     * residue anyway, so we can discard it from our list to test.
     */
    int64_t factor_m = 0, addend_m = 0, last_mod = 0;

    size_t out = 0;
    for (size_t i = 0; i < s->navoids; i++) {
        int64_t mod = s->avoids[i].mod, res = s->avoids[i].res;
        if (mod != last_mod) {
            last_mod = mod;
            addend_m = mp_mod_known_integer(s->addend, mod);
            factor_m = mp_mod_known_integer(s->factor, mod);
        }

        if (factor_m == 0) {
            assert(res != addend_m);
            continue;
        }

        res = (res - addend_m) * invert(factor_m, mod);
        res %= mod;
        if (res < 0)
            res += mod;

        s->avoids[out].mod = mod;
        s->avoids[out].res = res;
        out++;
    }

    s->navoids = out;

    s->ready = true;
}